

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *rest,
          basic_string_view<char,_std::char_traits<char>_> *rest_1,
          basic_string_view<char,_std::char_traits<char>_> *rest_2,
          basic_string_view<char,_std::char_traits<char>_> *rest_3,
          basic_string_view<char,_std::char_traits<char>_> *rest_4,
          basic_string_view<char,_std::char_traits<char>_> *rest_5,
          basic_string_view<char,_std::char_traits<char>_> *rest_6,
          basic_string_view<char,_std::char_traits<char>_> *rest_7,
          basic_string_view<char,_std::char_traits<char>_> *rest_8,
          basic_string_view<char,_std::char_traits<char>_> *rest_9,
          basic_string_view<char,_std::char_traits<char>_> *rest_10,
          basic_string_view<char,_std::char_traits<char>_> *rest_11,
          basic_string_view<char,_std::char_traits<char>_> *rest_12,
          basic_string_view<char,_std::char_traits<char>_> *rest_13)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  string_view local_40;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0,3);
  if (sVar2 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string_view<char>, Rest = <std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                 );
  }
  uVar3 = value->_M_len;
  if (sVar2 <= value->_M_len) {
    uVar3 = sVar2;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,value->_M_str,value->_M_str + uVar3);
  cVar1 = value->_M_str[sVar2];
  if (cVar1 == '%') {
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              ((vector<char,std::allocator<char>> *)&this->m_first,
               (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,first->_M_str,first->_M_str + first->_M_len);
  }
  else {
    if (cVar1 == '^') {
      if (sVar2 == value->_M_len - 1) {
        __assert_fail("offset != value.size() - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                      ,0x12a,
                      "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string_view<char>, Rest = <std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                     );
      }
      write_impl(this,value->_M_str[sVar2 + 1]);
      uVar3 = sVar2 + 2;
      local_40._M_len = value->_M_len - uVar3;
      if (uVar3 <= value->_M_len) {
        local_40._M_str = value->_M_str + uVar3;
        write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (this,&local_40,first,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8
                   ,rest_9,rest_10,rest_11,rest_12,rest_13);
        return;
      }
      goto LAB_00170a8a;
    }
    writer::write_code((writer *)this,first);
  }
  uVar3 = sVar2 + 1;
  if (sVar2 < value->_M_len) {
    local_40._M_len = value->_M_len - uVar3;
    local_40._M_str = value->_M_str + uVar3;
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,
               rest_10,rest_11,rest_12,rest_13);
    return;
  }
LAB_00170a8a:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar3);
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }